

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::_InternalParse
          (CodeGeneratorResponse_File *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  char cVar4;
  uint32 res;
  uint tag;
  string *s;
  byte *p;
  pair<const_char_*,_unsigned_int> pVar5;
  pair<const_char_*,_bool> pVar6;
  
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar6._8_8_ = 0;
      pVar6.first = ptr;
    }
    else {
      pVar6._8_8_ = 1;
      pVar6.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar6 = internal::EpsCopyInputStream::DoneFallback
                          (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    p = (byte *)pVar6.first;
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)p;
    }
    bVar1 = *p;
    pVar5.second._0_1_ = bVar1;
    pVar5.first = (char *)(p + 1);
    pVar5._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = p[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar5 = internal::ReadTagFallback((char *)p,res);
      }
      else {
        pVar5.second = res;
        pVar5.first = (char *)(p + 2);
        pVar5._12_4_ = 0;
      }
    }
    ptr = pVar5.first;
    if (ptr == (char *)0x0) {
      cVar4 = '\x04';
    }
    else {
      tag = pVar5.second;
      uVar3 = (uint)(pVar5._8_8_ >> 3) & 0x1fffffff;
      cVar4 = (char)pVar5.second;
      if (uVar3 == 0xf) {
        if (cVar4 != 'z') goto LAB_00270e79;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        if ((this->content_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (&this->content_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        s = (this->content_).ptr_;
LAB_00270e51:
        ptr = internal::InlineGreedyStringParser(s,ptr,ctx);
      }
      else {
        if (uVar3 == 2) {
          if (cVar4 != '\x12') goto LAB_00270e79;
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          if ((this->insertion_point_).ptr_ ==
              (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstanceNoArena
                      (&this->insertion_point_,
                       (string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          s = (this->insertion_point_).ptr_;
          goto LAB_00270e51;
        }
        if ((uVar3 == 1) && (cVar4 == '\n')) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          if ((this->name_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstanceNoArena
                      (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          s = (this->name_).ptr_;
          goto LAB_00270e51;
        }
LAB_00270e79:
        if (tag == 0 || (tag & 7) == 4) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
          cVar4 = '\a';
          goto LAB_00270e6e;
        }
        ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
      }
      cVar4 = (ptr == (char *)0x0) * '\x02' + '\x02';
    }
LAB_00270e6e:
    if (cVar4 != '\x02') {
      if (cVar4 == '\x04') {
        ptr = (char *)0x0;
      }
      return ptr;
    }
  } while( true );
}

Assistant:

const char* CodeGeneratorResponse_File::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorResponse.File.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string insertion_point = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_insertion_point(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string content = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 122)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_content(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorResponse.File.content");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}